

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImDrawList::PopTextureID(ImDrawList *this)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  iVar1 = (this->_TextureIdStack).Size;
  iVar3 = iVar1 + -1;
  (this->_TextureIdStack).Size = iVar3;
  if (iVar3 == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (this->_TextureIdStack).Data[(long)iVar1 + -2];
  }
  (this->_CmdHeader).TextureId = pvVar2;
  _OnChangedTextureID(this);
  return;
}

Assistant:

inline void         pop_back()                          { IM_ASSERT(Size > 0); Size--; }